

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

uint32_t lzma_mf_bt3_find(lzma_mf *mf,lzma_match *matches)

{
  uint32_t cur_match_00;
  uint32_t pos_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte *cur_00;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  lzma_match *plVar7;
  uint local_8c;
  uint32_t local_80;
  uint32_t len_best;
  uint32_t cur_match;
  uint32_t delta2;
  uint32_t hash_value;
  uint32_t hash_2_value;
  uint32_t temp;
  uint32_t matches_count;
  uint32_t pos;
  uint8_t *cur;
  uint32_t len_limit;
  lzma_match *matches_local;
  lzma_mf *mf_local;
  uint64_t x;
  uint local_14;
  
  cur._4_4_ = mf_avail(mf);
  if (cur._4_4_ < mf->nice_len) {
    if ((cur._4_4_ < 3) || (mf->action == LZMA_SYNC_FLUSH)) {
      if (mf->action != LZMA_RUN) {
        move_pending(mf);
        return 0;
      }
      __assert_fail("mf->action != LZMA_RUN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                    ,0x26e,"uint32_t lzma_mf_bt3_find(lzma_mf *, lzma_match *)");
    }
  }
  else {
    cur._4_4_ = mf->nice_len;
  }
  cur_00 = mf_ptr(mf);
  pos_00 = mf->read_pos + mf->offset;
  hash_2_value = 0;
  uVar1 = lzma_crc32_table[0][*cur_00] ^ (uint)cur_00[1];
  uVar2 = uVar1 & 0x3ff;
  uVar1 = (uVar1 ^ (uint)cur_00[2] << 8) & mf->hash_mask;
  uVar3 = pos_00 - mf->hash[uVar2];
  cur_match_00 = mf->hash[uVar1 + 0x400];
  mf->hash[uVar2] = pos_00;
  mf->hash[uVar1 + 0x400] = pos_00;
  local_80 = 2;
  if ((uVar3 < mf->cyclic_size) && (cur_00[-(ulong)uVar3] == *cur_00)) {
    x._4_4_ = 2;
    if (cur._4_4_ < 2) {
      __assert_fail("len <= limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                    ,0x2e,
                    "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)")
      ;
    }
    if (0x7fffffff < cur._4_4_) {
      __assert_fail("limit <= UINT32_MAX / 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                    ,0x2f,
                    "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)")
      ;
    }
LAB_00238caf:
    if (x._4_4_ < cur._4_4_) {
      uVar4 = read64ne(cur_00 + x._4_4_);
      uVar5 = read64ne(cur_00 + ((ulong)x._4_4_ - (ulong)uVar3));
      uVar6 = uVar4 - uVar5;
      if (uVar6 == 0) goto LAB_00238d27;
      uVar1 = 0;
      for (; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
        uVar1 = uVar1 + 1;
      }
      local_8c = (uVar1 >> 3) + x._4_4_;
      if (cur._4_4_ <= local_8c) {
        local_8c = cur._4_4_;
      }
      local_14 = local_8c;
    }
    else {
      local_14 = cur._4_4_;
    }
    local_80 = local_14;
    matches->len = local_14;
    matches->dist = uVar3 - 1;
    hash_2_value = 1;
    if (local_14 == cur._4_4_) {
      bt_skip_func(cur._4_4_,pos_00,cur_00,cur_match_00,mf->depth,mf->son,mf->cyclic_pos,
                   mf->cyclic_size);
      move_pos(mf);
      return 1;
    }
  }
  plVar7 = bt_find_func(cur._4_4_,pos_00,cur_00,cur_match_00,mf->depth,mf->son,mf->cyclic_pos,
                        mf->cyclic_size,matches + hash_2_value,local_80);
  move_pos(mf);
  return (uint32_t)((long)plVar7 - (long)matches >> 3);
LAB_00238d27:
  x._4_4_ = x._4_4_ + 8;
  goto LAB_00238caf;
}

Assistant:

extern uint32_t
lzma_mf_bt3_find(lzma_mf *mf, lzma_match *matches)
{
	header_find(true, 3);

	hash_3_calc();

	const uint32_t delta2 = pos - mf->hash[hash_2_value];
	const uint32_t cur_match = mf->hash[FIX_3_HASH_SIZE + hash_value];

	mf->hash[hash_2_value] = pos;
	mf->hash[FIX_3_HASH_SIZE + hash_value] = pos;

	uint32_t len_best = 2;

	if (delta2 < mf->cyclic_size && *(cur - delta2) == *cur) {
		len_best = lzma_memcmplen(
				cur, cur - delta2, len_best, len_limit);

		matches[0].len = len_best;
		matches[0].dist = delta2 - 1;
		matches_count = 1;

		if (len_best == len_limit) {
			bt_skip();
			return 1; // matches_count
		}
	}

	bt_find(len_best);
}